

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::StringFieldGenerator::GenerateInlineAccessorDefinitions
          (StringFieldGenerator *this,Printer *printer)

{
  ulong uVar1;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::std::string& $classname$::$name$() const {\n  return *$name$_;\n}\ninline void $classname$::set_$name$(const ::std::string& value) {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n    $name$_ = new ::std::string;\n  }\n  $name$_->assign(value);\n}\ninline void $classname$::set_$name$(const char* value) {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n    $name$_ = new ::std::string;\n  }\n  $name$_->assign(value);\n}\ninline void $classname$::set_$name$(const $pointer_type$* value, size_t size) {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n    $name$_ = new ::std::string;\n  }\n  $name$_->assign(reinterpret_cast<const char*>(value), size);\n}\ninline ::std::string* $classname$::mutable_$name$() {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n"
                    );
  FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    io::Printer::Print(printer,&this->variables_,
                       "    $name$_ = new ::std::string(*$default_variable$);\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,"    $name$_ = new ::std::string;\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "  }\n  return $name$_;\n}\ninline ::std::string* $classname$::release_$name$() {\n  clear_has_$name$();\n  if ($name$_ == $default_variable$) {\n    return NULL;\n  } else {\n    ::std::string* temp = $name$_;\n    $name$_ = const_cast< ::std::string*>($default_variable$);\n    return temp;\n  }\n}\ninline void $classname$::set_allocated_$name$(::std::string* $name$) {\n  if ($name$_ != $default_variable$) {\n    delete $name$_;\n  }\n  if ($name$) {\n    set_has_$name$();\n    $name$_ = $name$;\n  } else {\n    clear_has_$name$();\n    $name$_ = const_cast< ::std::string*>($default_variable$);\n  }\n}\n"
                    );
  return;
}

Assistant:

void StringFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline const ::std::string& $classname$::$name$() const {\n"
    "  return *$name$_;\n"
    "}\n"
    "inline void $classname$::set_$name$(const ::std::string& value) {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    $name$_ = new ::std::string;\n"
    "  }\n"
    "  $name$_->assign(value);\n"
    "}\n"
    "inline void $classname$::set_$name$(const char* value) {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    $name$_ = new ::std::string;\n"
    "  }\n"
    "  $name$_->assign(value);\n"
    "}\n"
    "inline "
    "void $classname$::set_$name$(const $pointer_type$* value, size_t size) {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    $name$_ = new ::std::string;\n"
    "  }\n"
    "  $name$_->assign(reinterpret_cast<const char*>(value), size);\n"
    "}\n"
    "inline ::std::string* $classname$::mutable_$name$() {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n");
  if (descriptor_->default_value_string().empty()) {
    printer->Print(variables_,
      "    $name$_ = new ::std::string;\n");
  } else {
    printer->Print(variables_,
      "    $name$_ = new ::std::string(*$default_variable$);\n");
  }
  printer->Print(variables_,
    "  }\n"
    "  return $name$_;\n"
    "}\n"
    "inline ::std::string* $classname$::release_$name$() {\n"
    "  clear_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    return NULL;\n"
    "  } else {\n"
    "    ::std::string* temp = $name$_;\n"
    "    $name$_ = const_cast< ::std::string*>($default_variable$);\n"
    "    return temp;\n"
    "  }\n"
    "}\n"
    "inline void $classname$::set_allocated_$name$(::std::string* $name$) {\n"
    "  if ($name$_ != $default_variable$) {\n"
    "    delete $name$_;\n"
    "  }\n"
    "  if ($name$) {\n"
    "    set_has_$name$();\n"
    "    $name$_ = $name$;\n"
    "  } else {\n"
    "    clear_has_$name$();\n"
    "    $name$_ = const_cast< ::std::string*>($default_variable$);\n"
    "  }\n"
    "}\n");
}